

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-item-wear.c
# Opt level: O2

_Bool borg_wear_recharge(void)

{
  ushort uVar1;
  borg_item_conflict *pbVar2;
  _Bool _Var3;
  wchar_t wVar4;
  char *what;
  angband_constants *paVar5;
  ulong uVar6;
  int iVar7;
  wchar_t wVar8;
  long lVar9;
  ulong uVar10;
  
  _Var3 = borg_check_rest(borg.c.y,borg.c.x);
  if ((!_Var3) || (borg.trait[0x6c] != 0)) {
    return false;
  }
  uVar6 = 0xffffffffffffffff;
  lVar9 = 0;
  wVar8 = L'\xffffffff';
  paVar5 = z_info;
  for (uVar10 = 0; pbVar2 = borg_items, uVar1 = paVar5->pack_size, uVar10 < (ulong)uVar1 + 0xc;
      uVar10 = uVar10 + 1) {
    if ((borg_items->curses[lVar9 + -0x26] != false) &&
       (*(short *)(borg_items->curses + lVar9 + -0x18) != 0)) {
      wVar4 = borg_wield_slot((borg_item *)(borg_items->desc + lVar9));
      paVar5 = z_info;
      if (pbVar2->curses[lVar9 + -0x2a] == true) {
        if ((sv_light_torch != (uint)pbVar2->curses[lVar9 + -0x29]) &&
           (sv_light_lantern != (uint)pbVar2->curses[lVar9 + -0x29])) goto LAB_0021ccf7;
      }
      else if ((pbVar2->curses[lVar9 + -0x2a] != true) ||
              ((sv_rod_recall == (uint)pbVar2->curses[lVar9 + -0x29] || (borg.trait[0x69] != 0)))) {
LAB_0021ccf7:
        uVar6 = uVar10 & 0xffffffff;
        wVar8 = wVar4;
      }
    }
    lVar9 = lVar9 + 0x388;
  }
  iVar7 = (int)uVar6;
  if (iVar7 == -1) {
    return false;
  }
  if (iVar7 < (int)(uint)uVar1) {
    uVar6 = (ulong)iVar7;
    if (borg_items[uVar6].tval != '\x18') {
      if (wVar8 < (int)(uint)uVar1) {
        return false;
      }
      borg_note("# Swapping Item for Recharge.");
      borg_keypress(0xe000);
      borg_keypress(0x77);
      borg_keypress((int)"abcdefgimnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ"[uVar6]);
      goto LAB_0021cd88;
    }
  }
  else {
    uVar6 = uVar6 & 0xffffffff;
  }
  what = format("# Waiting for \'%s\' to Recharge.",borg_items + uVar6);
  borg_note(what);
LAB_0021cd88:
  borg_keypress(0x52);
  borg_keypress(0x37);
  borg_keypress(0x35);
  borg_keypress(0x9c);
  return true;
}

Assistant:

bool borg_wear_recharge(void)
{
    int i, b_i = -1;
    int slot   = -1;
    int b_slot = -1;

    /* No resting in danger */
    if (!borg_check_rest(borg.c.y, borg.c.x))
        return false;

    /* Not if hungry */
    if (borg.trait[BI_ISWEAK])
        return false;

    /* Look for an (wearable- non rod) item to recharge */
    for (i = 0; i < INVEN_TOTAL; i++) {
        borg_item *item = &borg_items[i];

        /* Skip empty items */
        if (!item->iqty)
            continue;

        /* skip items that are charged */
        if (!item->timeout)
            continue;

        /* Where can it be worn? */
        slot = borg_wield_slot(item);
        
        /* if this is a rod, only count it if it is a rod of recall */
        /* and we are in town.  This is to prevent walking down when */
        /* the borg has a perfectly serviceable rod */
        if (item->tval == TV_ROD && item->sval != sv_rod_recall
            && borg.trait[BI_CDEPTH] == 0)
            continue;

        /* skip non-ego lights, No need to rest to recharge a torch, which uses
         * fuels turns in o_ptr->timeout */
        if (item->tval == TV_LIGHT
            && (item->sval == sv_light_torch || item->sval == sv_light_lantern))
            continue;

        /* note this one */
        b_i    = i;
        b_slot = slot;
    }

    /* nothing found */
    if (b_i == -1)
        return false;

    if (b_i >= INVEN_WIELD || borg_items[b_i].tval == TV_ROD) {
        /* Item is worn, no swap is nec. */
        borg_note(
            format("# Waiting for '%s' to Recharge.", borg_items[b_i].desc));

        /* Rest for a while */
        borg_keypress('R');
        borg_keypress('7');
        borg_keypress('5');
        borg_keypress(KC_ENTER);

        /* done */
        return true;
    }
    /* Item must be worn to be recharged
     */
    if (b_slot >= INVEN_WIELD) {

        /* wear the item */
        borg_note("# Swapping Item for Recharge.");
        borg_keypress(ESCAPE);
        borg_keypress('w');
        borg_keypress(all_letters_nohjkl[b_i]);

        /* rest for a while */
        borg_keypress('R');
        borg_keypress('7');
        borg_keypress('5');
        borg_keypress(KC_ENTER);

        /* done */
        return true;
    }

    /* nothing to recharge */
    return false;
}